

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_1509;
  string local_1508;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> local_14e8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1508,"TPZGeoElRefLess",&local_1509);
  uVar1 = Hash(&local_1508);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend(&local_14e8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::ClassId(&local_14e8);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::~TPZGeoBlend(&local_14e8);
  std::__cxx11::string::~string((string *)&local_1508);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}